

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O0

void mat4x4_mul(vec4 *M,vec4 *a,vec4 *b)

{
  int local_74;
  int local_70;
  int c;
  int r;
  int k;
  mat4x4 temp;
  vec4 *b_local;
  vec4 *a_local;
  vec4 *M_local;
  
  for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
    for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
      (&r)[(long)local_74 * 4 + (long)local_70] = 0;
      for (c = 0; c < 4; c = c + 1) {
        (&r)[(long)local_74 * 4 + (long)local_70] =
             (int)(a[c][local_70] * b[local_74][c] +
                  (float)(&r)[(long)local_74 * 4 + (long)local_70]);
      }
    }
  }
  mat4x4_dup(M,(vec4 *)&r);
  return;
}

Assistant:

static inline void mat4x4_mul(mat4x4 M, mat4x4 a, mat4x4 b)
{
	mat4x4 temp;
	int k, r, c;
	for(c=0; c<4; ++c) for(r=0; r<4; ++r) {
		temp[c][r] = 0.f;
		for(k=0; k<4; ++k)
			temp[c][r] += a[k][r] * b[c][k];
	}
	mat4x4_dup(M, temp);
}